

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O3

void __thiscall soplex::SPxSolverBase<double>::unShift(SPxSolverBase<double> *this)

{
  double *pdVar1;
  double dVar2;
  Representation RVar3;
  uint uVar4;
  Status SVar5;
  SPxOut *pSVar6;
  pointer pdVar7;
  pointer pdVar8;
  UpdateVector<double> *pUVar9;
  pointer pdVar10;
  pointer pdVar11;
  char cVar12;
  LPRowSetBase<double> *pLVar13;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar14;
  int iVar15;
  Status *pSVar16;
  pointer pdVar17;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *this_00;
  ulong uVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  Verbosity old_verbosity;
  SPxId l_id;
  double local_58;
  double local_50;
  double local_48;
  DataKey local_40;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *local_38;
  
  pSVar6 = this->spxout;
  if ((pSVar6 != (SPxOut *)0x0) && (4 < (int)pSVar6->m_verbosity)) {
    local_50 = (double)CONCAT44(local_50._4_4_,pSVar6->m_verbosity);
    local_58 = (double)CONCAT44(local_58._4_4_,5);
    (*pSVar6->_vptr_SPxOut[2])();
    pSVar6 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity],"DSHIFT07 = ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity],"unshifting ...",0xe);
    cVar12 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) +
                    cVar12);
    std::ostream::put(cVar12);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_50);
  }
  if (this->initialized == true) {
    this->theShift = 0.0;
    if (this->theType == ENTER) {
      local_48 = entertol(this);
      uVar4 = (this->thecovectors->set).thenum;
      if (this->theRep == COLUMN) {
        if (0 < (int)uVar4) {
          uVar18 = (ulong)uVar4 + 1;
          do {
            local_40 = (this->super_SPxBasisBase<double>).theBaseId.data[uVar18 - 2].super_DataKey;
            pLVar13 = (LPRowSetBase<double> *)
                      &(this->super_SPxLPBase<double>).super_LPColSetBase<double>;
            if (local_40.info < 1) {
              pLVar13 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>;
            }
            iVar15 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                               (&(pLVar13->super_SVSetBase<double>).set,&local_40);
            if (local_40.info < 0) {
              local_50 = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar15];
              local_58 = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar15];
            }
            else {
              local_50 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar15];
              local_58 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar15];
            }
            if ((local_50 != local_58) || (NAN(local_50) || NAN(local_58))) {
              pdVar7 = (this->theFvec->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dVar20 = pdVar7[uVar18 + 0xfffffffffffffffe];
              if (local_48 + local_50 <= dVar20) {
                if (local_50 < dVar20) {
                  this->theShift =
                       ((this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar18 - 2] - local_50) +
                       this->theShift;
                }
              }
              else {
                (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar18 - 2] = local_50;
              }
              dVar20 = pdVar7[uVar18 + 0xfffffffffffffffe];
              if (dVar20 <= local_58 - local_48) {
                if (dVar20 < local_58) {
                  dVar20 = this->theShift -
                           ((this->theLBbound).val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar18 - 2] - local_58);
                  goto LAB_001bdfee;
                }
              }
              else {
                (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar18 - 2] = local_58;
              }
            }
            else {
              dVar20 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar18 - 2];
              if (dVar20 <= local_50) {
                dVar20 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar18 - 2];
                if (dVar20 < local_58) {
                  dVar20 = (local_58 - dVar20) + this->theShift;
LAB_001bdfee:
                  this->theShift = dVar20;
                }
              }
              else {
                this->theShift = (dVar20 - local_50) + this->theShift;
              }
            }
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
        lVar19 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar19) {
          dVar20 = this->theShift;
          pSVar16 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
          pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar17 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar8 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar10 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar18 = lVar19 + 1;
          do {
            if (pSVar16[uVar18 - 2] * this->theRep < 1) {
              dVar2 = pdVar7[uVar18 - 2];
              dVar21 = -pdVar17[uVar18 - 2];
              dVar22 = pdVar8[uVar18 - 2];
              if (-dVar2 < dVar22) {
                dVar20 = dVar20 + dVar2 + dVar22;
                this->theShift = dVar20;
              }
              dVar2 = pdVar10[uVar18 - 2];
              if (dVar2 < dVar21) {
                dVar20 = dVar20 + (dVar21 - dVar2);
                this->theShift = dVar20;
              }
            }
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
        lVar19 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar19) {
          dVar20 = this->theShift;
          pSVar16 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
          pdVar7 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar17 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar8 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar10 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar18 = lVar19 + 1;
          do {
            if (pSVar16[uVar18 - 2] * this->theRep < 1) {
              dVar2 = pdVar17[uVar18 - 2];
              dVar22 = pdVar7[uVar18 - 2];
              dVar21 = pdVar8[uVar18 - 2];
              if (dVar2 < dVar21) {
                dVar20 = dVar20 + (dVar21 - dVar2);
                this->theShift = dVar20;
              }
              dVar2 = pdVar10[uVar18 - 2];
              if (dVar2 < dVar22) {
                dVar20 = dVar20 + (dVar22 - dVar2);
                this->theShift = dVar20;
              }
            }
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
      }
      else {
        if (0 < (int)uVar4) {
          uVar18 = (ulong)uVar4 + 1;
          local_38 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set;
          do {
            local_40 = (this->super_SPxBasisBase<double>).theBaseId.data[uVar18 - 2].super_DataKey;
            this_00 = &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set;
            if (local_40.info < 1) {
              this_00 = local_38;
            }
            iVar15 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number(this_00,&local_40);
            local_58 = 0.0;
            local_50 = 0.0;
            pDVar14 = &(this->super_SPxBasisBase<double>).thedesc.colstat;
            if (local_40.info < 0) {
              pDVar14 = &(this->super_SPxBasisBase<double>).thedesc.rowstat;
            }
            clearDualBounds(this,pDVar14->data[iVar15],&local_50,&local_58);
            pdVar7 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar17 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            dVar20 = pdVar7[uVar18 - 2];
            if ((dVar20 != pdVar17[uVar18 - 2]) || (NAN(dVar20) || NAN(pdVar17[uVar18 - 2]))) {
              if (dVar20 <= local_50) {
                this->theShift = this->theShift - (dVar20 - local_50);
              }
              else {
                dVar20 = (dVar20 - local_50) + this->theShift;
LAB_001be534:
                this->theShift = dVar20;
              }
            }
            else {
              pdVar8 = (this->theFvec->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dVar2 = pdVar8[uVar18 + 0xfffffffffffffffe];
              if (local_50 - local_48 <= dVar2) {
                if (local_50 < dVar2) {
                  this->theShift = (dVar20 - local_50) + this->theShift;
                }
              }
              else {
                pdVar7[uVar18 - 2] = local_50;
              }
              dVar20 = pdVar8[uVar18 + 0xfffffffffffffffe];
              if (dVar20 <= local_48 + local_58) {
                if (dVar20 < local_58) {
                  dVar20 = this->theShift - (pdVar17[uVar18 - 2] - local_58);
                  goto LAB_001be534;
                }
              }
              else {
                pdVar17[uVar18 - 2] = local_58;
              }
            }
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
        lVar19 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar19) {
          uVar18 = lVar19 + 1;
          do {
            SVar5 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar18 - 2];
            if (this->theRep * SVar5 < 1) {
              local_58 = 0.0;
              local_50 = 0.0;
              clearDualBounds(this,SVar5,&local_50,&local_58);
              dVar20 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar18 - 2];
              if (local_50 < dVar20) {
                this->theShift = (dVar20 - local_50) + this->theShift;
              }
              dVar20 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar18 - 2];
              if (dVar20 < local_58) {
                this->theShift = (local_58 - dVar20) + this->theShift;
              }
            }
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
        lVar19 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar19) {
          uVar18 = lVar19 + 1;
          do {
            SVar5 = (this->super_SPxBasisBase<double>).thedesc.colstat.data[uVar18 - 2];
            if (this->theRep * SVar5 < 1) {
              local_58 = 0.0;
              local_50 = 0.0;
              clearDualBounds(this,SVar5,&local_50,&local_58);
              dVar20 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar18 - 2];
              if (local_50 < dVar20) {
                this->theShift = (dVar20 - local_50) + this->theShift;
              }
              dVar20 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar18 - 2];
              if (dVar20 < local_58) {
                this->theShift = (local_58 - dVar20) + this->theShift;
              }
            }
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
      }
    }
    else {
      local_48 = leavetol(this);
      RVar3 = this->theRep;
      uVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum;
      if (RVar3 == COLUMN) {
        if (0 < (int)uVar4) {
          pSVar16 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
          uVar18 = (ulong)uVar4 + 1;
          do {
            local_58 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar18 - 2];
            local_50 = local_58;
            clearDualBounds(this,pSVar16[uVar18 - 2],&local_50,&local_58);
            pSVar16 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
            if (this->theRep * pSVar16[uVar18 - 2] < 1) {
              pdVar7 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar17 = (this->theCoPvec->super_VectorBase<double>).val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar1 = pdVar17 + uVar18 + 0xfffffffffffffffe;
              if (local_48 + local_50 < *pdVar1 || local_48 + local_50 == *pdVar1) {
                this->theShift = (pdVar7[uVar18 - 2] - local_50) + this->theShift;
              }
              else {
                pdVar7[uVar18 - 2] = local_50;
                if ((local_50 == local_58) && (!NAN(local_50) && !NAN(local_58))) {
                  (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar18 - 2] = local_58;
                }
              }
              pdVar8 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (pdVar17[uVar18 + 0xfffffffffffffffe] <= local_58 - local_48) {
                dVar20 = local_58 - pdVar8[uVar18 - 2];
                goto LAB_001bdc50;
              }
              pdVar8[uVar18 - 2] = local_58;
              if ((local_50 == local_58) && (!NAN(local_50) && !NAN(local_58))) {
                pdVar7[uVar18 - 2] = local_50;
              }
            }
            else {
              dVar20 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar18 - 2];
              if ((local_50 < dVar20) ||
                 (local_50 = (this->theLRbound).val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar18 - 2], dVar20 = local_58,
                 local_50 < local_58)) {
                dVar20 = dVar20 - local_50;
LAB_001bdc50:
                this->theShift = dVar20 + this->theShift;
              }
            }
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
        lVar19 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar19) {
          pSVar16 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
          uVar18 = lVar19 + 1;
          do {
            local_58 = -(this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar18 - 2];
            local_50 = local_58;
            clearDualBounds(this,pSVar16[uVar18 - 2],&local_58,&local_50);
            pSVar16 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
            if (this->theRep * pSVar16[uVar18 - 2] < 1) {
              pdVar7 = (this->thePvec->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar1 = pdVar7 + uVar18 + 0xfffffffffffffffe;
              if (local_48 - local_50 < *pdVar1 || local_48 - local_50 == *pdVar1) {
                pdVar17 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                this->theShift = local_50 + pdVar17[uVar18 - 2] + this->theShift;
              }
              else {
                pdVar17 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pdVar17[uVar18 - 2] = -local_50;
                if ((local_50 == local_58) && (!NAN(local_50) && !NAN(local_58))) {
                  (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar18 - 2] = -local_58;
                }
              }
              pdVar8 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (pdVar7[uVar18 + 0xfffffffffffffffe] <= -local_58 - local_48) {
                dVar20 = pdVar8[uVar18 - 2];
LAB_001bde06:
                dVar20 = -local_58 - dVar20;
                goto LAB_001bde0a;
              }
              pdVar8[uVar18 - 2] = -local_58;
              if ((local_50 == local_58) && (!NAN(local_50) && !NAN(local_58))) {
                pdVar17[uVar18 - 2] = -local_50;
              }
            }
            else {
              dVar20 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar18 - 2];
              if (dVar20 <= -local_50) {
                dVar20 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar18 - 2];
                if (dVar20 < -local_58) goto LAB_001bde06;
              }
              else {
                dVar20 = dVar20 + local_50;
LAB_001bde0a:
                this->theShift = dVar20 + this->theShift;
              }
            }
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
      }
      else {
        if (0 < (int)uVar4) {
          pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar17 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pSVar16 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
          pUVar9 = this->thePvec;
          pdVar8 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar10 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar18 = (ulong)uVar4 + 1;
          do {
            dVar20 = pdVar17[uVar18 - 2];
            dVar2 = pdVar7[uVar18 - 2];
            if ((dVar20 != dVar2) || (NAN(dVar20) || NAN(dVar2))) {
              if (0 < pSVar16[uVar18 - 2] * RVar3) {
                dVar22 = pdVar8[uVar18 - 2];
                if (dVar20 < dVar22) goto LAB_001be203;
                dVar20 = pdVar10[uVar18 - 2];
                if (dVar2 <= dVar20) goto LAB_001be217;
                goto LAB_001be1d6;
              }
              pdVar11 = (pUVar9->super_VectorBase<double>).val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar1 = pdVar11 + uVar18 + 0xfffffffffffffffe;
              if (local_48 + dVar20 < *pdVar1 || local_48 + dVar20 == *pdVar1) {
                this->theShift = (pdVar8[uVar18 - 2] - dVar20) + this->theShift;
              }
              else {
                pdVar8[uVar18 - 2] = dVar20;
              }
              if (pdVar11[uVar18 + 0xfffffffffffffffe] <= dVar2 - local_48) goto LAB_001be1cf;
              pdVar10[uVar18 - 2] = dVar2;
            }
            else {
              dVar22 = pdVar8[uVar18 - 2];
              if (dVar20 < dVar22) {
LAB_001be203:
                this->theShift = (dVar22 - dVar20) + this->theShift;
              }
              else {
LAB_001be1cf:
                dVar20 = pdVar10[uVar18 - 2];
LAB_001be1d6:
                this->theShift = (dVar2 - dVar20) + this->theShift;
              }
            }
LAB_001be217:
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
        lVar19 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar19) {
          pdVar7 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar17 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pSVar16 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
          pUVar9 = this->theCoPvec;
          pdVar8 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar10 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar18 = lVar19 + 1;
          do {
            dVar20 = pdVar17[uVar18 - 2];
            dVar2 = pdVar7[uVar18 - 2];
            if ((dVar20 != dVar2) || (NAN(dVar20) || NAN(dVar2))) {
              if (0 < pSVar16[uVar18 - 2] * RVar3) {
                dVar22 = pdVar8[uVar18 - 2];
                if (dVar20 < dVar22) goto LAB_001be33b;
                dVar20 = pdVar10[uVar18 - 2];
                if (dVar2 <= dVar20) goto LAB_001be34f;
                goto LAB_001be30e;
              }
              pdVar11 = (pUVar9->super_VectorBase<double>).val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar1 = pdVar11 + uVar18 + 0xfffffffffffffffe;
              if (local_48 + dVar20 < *pdVar1 || local_48 + dVar20 == *pdVar1) {
                this->theShift = (pdVar8[uVar18 - 2] - dVar20) + this->theShift;
              }
              else {
                pdVar8[uVar18 - 2] = dVar20;
              }
              if (pdVar11[uVar18 + 0xfffffffffffffffe] <= dVar2 - local_48) goto LAB_001be307;
              pdVar10[uVar18 - 2] = dVar2;
            }
            else {
              dVar22 = pdVar8[uVar18 - 2];
              if (dVar20 < dVar22) {
LAB_001be33b:
                this->theShift = (dVar22 - dVar20) + this->theShift;
              }
              else {
LAB_001be307:
                dVar20 = pdVar10[uVar18 - 2];
LAB_001be30e:
                this->theShift = (dVar2 - dVar20) + this->theShift;
              }
            }
LAB_001be34f:
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::unShift(void)
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "DSHIFT07 = " << "unshifting ..." << std::endl;);

   if(isInitialized())
   {
      int i;
      R t_up, t_low;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      theShift = 0;

      if(type() == ENTER)
      {
         R eps = entertol();

         if(rep() == COLUMN)
         {
            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);

               if(l_id.type() == SPxId::ROW_ID)
               {
                  t_up = -this->lhs(l_num);
                  t_low = -this->rhs(l_num);
               }
               else
               {
                  assert(l_id.type() == SPxId::COL_ID);
                  t_up = this->upper(l_num);
                  t_low = this->lower(l_num);
               }

               if(t_up != t_low)
               {
                  if((*theFvec)[i] < t_up + eps)  // check allowed violation
                     theUBbound[i] = t_up; // reset shifted bound to original
                  else if((*theFvec)[i] > t_up)  // shifted bound is required for feasibility
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low - eps)  // check allowed violation
                     theLBbound[i] = t_low; // reset shifted bound to original
                  else if((*theFvec)[i] < t_low)  // shifted bound is required for feasibility
                     theShift -= theLBbound[i] - t_low;
               }
               else
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else if(theLBbound[i] < t_low)
                     theShift += t_low - theLBbound[i];
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = -this->lhs(i);
                  t_low = -this->rhs(i);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = this->upper(i);
                  t_low = this->lower(i);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);
               t_up = t_low = 0;

               if(l_id.type() == SPxId::ROW_ID)
                  clearDualBounds(ds.rowStatus(l_num), t_up, t_low);
               else
                  clearDualBounds(ds.colStatus(l_num), t_up, t_low);

               if(theUBbound[i] != theLBbound[i])
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else
                     theShift -= theUBbound[i] - t_up;
               }
               else
               {
                  /* if the basic (primal or dual) variable is fixed (e.g., basis status P_FREE in row representation)
                   * then shiftFvec() and shiftPvec() do not relax the bounds, but shift both, hence they may be outside
                   * of [t_low,t_up] */
                  assert(theLBbound[i] == theUBbound[i] || theUBbound[i] >= t_up);
                  assert(theLBbound[i] == theUBbound[i] || theLBbound[i] <= t_low);

                  if((*theFvec)[i] < t_up - eps)
                     theUBbound[i] = t_up;
                  else if((*theFvec)[i] > t_up)
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low + eps)
                     theLBbound[i] = t_low;
                  else if((*theFvec)[i] < t_low)
                     theShift -= theLBbound[i] - t_low;
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.rowStatus(i), t_up, t_low);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.colStatus(i), t_up, t_low);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
      }
      else
      {
         assert(type() == LEAVE);

         R eps = leavetol();

         if(rep() == COLUMN)
         {
            for(i = this->nRows(); i-- > 0;)
            {
               t_up = t_low = this->maxRowObj(i);
               clearDualBounds(ds.rowStatus(i), t_up, t_low);

               if(!isBasic(ds.rowStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                  {
                     theURbound[i] = t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLRbound[i] = t_low; // for fixed rows we change both bounds
                  }
                  else
                     theShift += theURbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                  {
                     theLRbound[i] = t_low; // reset bound to original value

                     if(t_up == t_low)
                        theURbound[i] = t_up; // for fixed rows we change both bounds
                  }
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = t_low = -this->maxObj(i);
               clearDualBounds(ds.colStatus(i), t_low, t_up);

               if(!isBasic(ds.colStatus(i)))
               {
                  if((*thePvec)[i] < -t_up + eps)
                  {
                     theUCbound[i] = -t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLCbound[i] = -t_low; // for fixed variables we change both bounds
                  }
                  else
                     theShift += theUCbound[i] - (-t_up);

                  if((*thePvec)[i] > -t_low - eps)
                  {
                     theLCbound[i] = -t_low; // reset bound to original value

                     if(t_up == t_low)
                        theUCbound[i] = -t_up; // for fixed variables we change both bounds
                  }
                  else
                     theShift += (-t_low) - theLCbound[i];
               }
               else if(theUCbound[i] > -t_up)
                  theShift += theUCbound[i] - (-t_up);
               else if(theLCbound[i] < -t_low)
                  theShift += (-t_low) - theLCbound[i];
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = this->nRows(); i-- > 0;)
            {
               t_up = this->rhs(i);
               t_low = this->lhs(i);

               if(t_up == t_low)
               {
                  if(theURbound[i] > t_up)
                     theShift += theURbound[i] - t_up;
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(!isBasic(ds.rowStatus(i)))
               {
                  if((*thePvec)[i] < t_up + eps)
                     theURbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theURbound[i] - t_up;

                  if((*thePvec)[i] > t_low - eps)
                     theLRbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = this->upper(i);
               t_low = this->lower(i);

               if(t_up == t_low)
               {
                  if(theUCbound[i] > t_up)
                     theShift += theUCbound[i] - t_up;
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(!isBasic(ds.colStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                     theUCbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theUCbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                     theLCbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(theUCbound[i] > t_up)
                  theShift += theUCbound[i] - t_up;
               else if(theLCbound[i] < t_low)
                  theShift += t_low - theLCbound[i];
            }
         }
      }
   }
}